

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::EltwiseParameter::EltwiseParameter(EltwiseParameter *this,EltwiseParameter *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EltwiseParameter_006f95a0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  (this->coeff_).current_size_ = 0;
  *(undefined8 *)&(this->coeff_).total_size_ = 0;
  *(undefined4 *)((long)&(this->coeff_).rep_ + 4) = 0;
  new_size = (from->coeff_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&this->coeff_,new_size);
    memcpy(((this->coeff_).rep_)->elements,((from->coeff_).rep_)->elements,
           (long)(from->coeff_).current_size_ << 2);
    (this->coeff_).current_size_ = (from->coeff_).current_size_;
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->stable_prod_grad_ = from->stable_prod_grad_;
  this->operation_ = from->operation_;
  return;
}

Assistant:

EltwiseParameter::EltwiseParameter(const EltwiseParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      coeff_(from.coeff_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&operation_, &from.operation_,
    reinterpret_cast<char*>(&stable_prod_grad_) -
    reinterpret_cast<char*>(&operation_) + sizeof(stable_prod_grad_));
  // @@protoc_insertion_point(copy_constructor:caffe.EltwiseParameter)
}